

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_bitset_container_lazy_xor
               (array_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint16_t *puVar4;
  long lVar5;
  
  if (src_2 != dst) {
    dst->cardinality = src_2->cardinality;
    memcpy(dst->words,src_2->words,0x2000);
  }
  iVar2 = src_1->cardinality;
  if ((long)iVar2 != 0) {
    puVar3 = dst->words;
    puVar4 = src_1->array;
    lVar5 = 0;
    do {
      uVar1 = *(ushort *)((long)puVar4 + lVar5);
      puVar3[uVar1 >> 6] = puVar3[uVar1 >> 6] ^ 1L << ((byte)uVar1 & 0x3f);
      lVar5 = lVar5 + 2;
    } while ((long)iVar2 * 2 != lVar5);
  }
  dst->cardinality = -1;
  return;
}

Assistant:

void array_bitset_container_lazy_xor(const array_container_t *src_1,
                                     const bitset_container_t *src_2,
                                     bitset_container_t *dst) {
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    bitset_flip_list(dst->words, src_1->array, src_1->cardinality);
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}